

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

WaitOrderStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::WaitOrderStatementSyntax,slang::syntax::WaitOrderStatementSyntax_const&>
          (BumpAllocator *this,WaitOrderStatementSyntax *args)

{
  WaitOrderStatementSyntax *this_00;
  
  this_00 = (WaitOrderStatementSyntax *)allocate(this,200,8);
  slang::syntax::WaitOrderStatementSyntax::WaitOrderStatementSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }